

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vars3.c
# Opt level: O2

LispPTR N_OP_assoc(LispPTR key,LispPTR list)

{
  LispPTR LVar1;
  ulong uVar2;
  cadr_cell cStack_30;
  
  if ((list != 0) &&
     ((*(ushort *)((ulong)(list >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5)) {
    cStack_30 = cadr(list);
    do {
      if (((*(ushort *)((ulong)(MDStypetbl + ((ulong)cStack_30 >> 9 & 0x7fffff)) ^ 2) & 0x7ff) == 5)
         && (LVar1 = car(cStack_30.car_cell), LVar1 == key)) goto LAB_0013248a;
      if ((*(ushort *)((ulong)(MDStypetbl + ((ulong)cStack_30 >> 0x29)) ^ 2) & 0x7ff) != 5) {
        cStack_30.car_cell = 0;
        cStack_30.cdr_cell = 0;
        LVar1 = 0;
        if (MachineState.irqend == 0) {
LAB_001324a4:
          MachineState.tosvalue = LVar1;
          MachineState.errorexit = 1;
          cStack_30.car_cell = 0xfffffffe;
          cStack_30.cdr_cell = 0xffffffff;
        }
        goto LAB_0013248a;
      }
      uVar2 = (ulong)cStack_30 >> 0x20;
      LVar1 = cStack_30.cdr_cell;
      cStack_30 = cadr(LVar1);
      if (MachineState.irqend == 0) goto LAB_001324a4;
    } while (uVar2 != 0);
  }
  cStack_30.car_cell = 0;
  cStack_30.cdr_cell = 0;
LAB_0013248a:
  return cStack_30.car_cell;
}

Assistant:

LispPTR N_OP_assoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdr; /* address of (cdr A-list); Lisp address */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (!Listp(list)) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdr = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdr))
      cadr1 = cadr(cdr);
    else
      cdr = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdr; /* for next execution */
      TIMER_EXIT(cdr);
    }
  } while (cdr != NIL_PTR);

  return (NIL_PTR);
}